

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O0

ACT_TYPE __thiscall
despot::POMDPXGreedyActionPolicy::Action
          (POMDPXGreedyActionPolicy *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  double dVar1;
  value_type pSVar2;
  int iVar3;
  size_type sVar4;
  const_reference ppSVar5;
  double dVar6;
  POMDPXState *state;
  State *particle;
  double dStack_48;
  int i;
  double reward;
  double dStack_38;
  ACT_TYPE action;
  double maxReward;
  ACT_TYPE bestAction;
  History *history_local;
  RandomStreams *streams_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  POMDPXGreedyActionPolicy *this_local;
  
  maxReward._4_4_ = 0;
  dStack_38 = -INFINITY;
  reward._4_4_ = 0;
  while( true ) {
    iVar3 = (*(this->pomdpx_model_->super_MDP)._vptr_MDP[3])();
    if (iVar3 <= reward._4_4_) break;
    dStack_48 = 0.0;
    particle._4_4_ = 0;
    while( true ) {
      sVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(particles);
      if (sVar4 <= (ulong)(long)particle._4_4_) break;
      ppSVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                          (particles,(long)particle._4_4_);
      pSVar2 = *ppSVar5;
      dVar1 = pSVar2->weight;
      dVar6 = Parser::GetReward(this->pomdpx_model_->parser_,
                                (vector<int,_std::allocator<int>_> *)(pSVar2 + 1),
                                (vector<int,_std::allocator<int>_> *)(pSVar2 + 1),reward._4_4_);
      dStack_48 = dVar1 * dVar6 + dStack_48;
      particle._4_4_ = particle._4_4_ + 1;
    }
    if (dStack_38 < dStack_48) {
      dStack_38 = dStack_48;
      maxReward._4_4_ = reward._4_4_;
    }
    reward._4_4_ = reward._4_4_ + 1;
  }
  return maxReward._4_4_;
}

Assistant:

ACT_TYPE Action(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		ACT_TYPE bestAction = 0;
		double maxReward = Globals::NEG_INFTY;
		for (ACT_TYPE action = 0; action < pomdpx_model_->NumActions(); action++) {
			double reward = 0;
			for (int i = 0; i < particles.size(); i++) {
				State* particle = particles[i];
				POMDPXState* state = static_cast<POMDPXState*>(particle);
				reward += state->weight
					* pomdpx_model_->parser_->GetReward(state->vec_id,
						state->vec_id, action);
			}
			if (reward > maxReward) {
				maxReward = reward;
				bestAction = action;
			}
		}
		return bestAction;
	}